

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_true>::insert_prefix_leaf(DaTrie<true,_false,_true> *this,Query *query)

{
  uint32_t uVar1;
  reference pvVar2;
  Query *in_RSI;
  Query *in_RDI;
  DaTrie<true,_false,_true> *unaff_retaddr;
  Query *query_00;
  
  query_00 = in_RDI;
  uVar1 = Query::node_pos(in_RSI);
  pvVar2 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar1);
  uVar1 = Bc::base(pvVar2);
  if (uVar1 == 0x7fffffff) {
    append_edge_(unaff_retaddr,query_00);
  }
  else {
    insert_edge_(unaff_retaddr,query_00);
  }
  uVar1 = Query::node_pos(in_RSI);
  pvVar2 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar1);
  uVar1 = Query::value(in_RSI);
  Bc::set_value(pvVar2,uVar1);
  return;
}

Assistant:

void insert_prefix_leaf(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(Prefix);

    if (bc_[query.node_pos()].base() != INVALID_VALUE) {
      insert_edge_(query);
    } else {
      append_edge_(query);
    }
    bc_[query.node_pos()].set_value(query.value());
  }